

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::Statement(Statement *this,Statement *aStatement)

{
  Statement *aStatement_local;
  Statement *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)aStatement);
  this->mpSQLite = aStatement->mpSQLite;
  std::shared_ptr<sqlite3_stmt>::shared_ptr
            (&this->mpPreparedStatement,&aStatement->mpPreparedStatement);
  this->mColumnCount = aStatement->mColumnCount;
  this->mbHasRow = (bool)(aStatement->mbHasRow & 1);
  this->mbDone = (bool)(aStatement->mbDone & 1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->mColumnNames,&aStatement->mColumnNames);
  aStatement->mpSQLite = (sqlite3 *)0x0;
  aStatement->mColumnCount = 0;
  aStatement->mbHasRow = false;
  aStatement->mbDone = false;
  return;
}

Assistant:

Statement::Statement(Statement&& aStatement) noexcept :
    mQuery(std::move(aStatement.mQuery)),
    mpSQLite(aStatement.mpSQLite),
    mpPreparedStatement(std::move(aStatement.mpPreparedStatement)),
    mColumnCount(aStatement.mColumnCount),
    mbHasRow(aStatement.mbHasRow),
    mbDone(aStatement.mbDone),
    mColumnNames(std::move(aStatement.mColumnNames))
{
    aStatement.mpSQLite = nullptr;
    aStatement.mColumnCount = 0;
    aStatement.mbHasRow = false;
    aStatement.mbDone = false;
}